

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

LineDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LineDirectiveSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,Token *args_3)

{
  Token fileName;
  Token level;
  LineDirectiveSyntax *this_00;
  Token *in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  Token *in_R8;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  BumpAllocator *in_stack_ffffffffffffff88;
  
  this_00 = (LineDirectiveSyntax *)
            allocate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  fileName.info = (Info *)*in_RSI;
  fileName._0_8_ = *(undefined8 *)(in_RDX + 8);
  level.info = (Info *)in_R8;
  level._0_8_ = in_RSI[1];
  slang::syntax::LineDirectiveSyntax::LineDirectiveSyntax(this_00,*in_RCX,*in_R8,fileName,level);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }